

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.h
# Opt level: O0

__m128i convolve_hi_y(__m128i *s,__m128i *coeffs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  __m128i *in_RSI;
  undefined8 *in_RDI;
  undefined1 in_XMM0_Be;
  undefined1 in_XMM0_Bf;
  undefined1 in_XMM0_Bg;
  undefined1 in_XMM0_Bh;
  undefined1 in_XMM0_Bi;
  undefined1 in_XMM0_Bj;
  undefined1 in_XMM0_Bk;
  undefined1 in_XMM0_Bl;
  undefined1 in_XMM0_Bm;
  undefined1 in_XMM0_Bn;
  undefined1 in_XMM0_Bo;
  undefined1 in_XMM0_Bp;
  __m128i alVar8;
  __m128i ss [4];
  undefined1 local_118;
  undefined1 uStack_117;
  undefined1 uStack_116;
  undefined1 uStack_115;
  undefined1 uStack_114;
  undefined1 uStack_113;
  undefined1 uStack_112;
  undefined1 uStack_111;
  undefined1 uStack_110;
  undefined1 uStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  undefined1 uStack_10c;
  undefined1 uStack_10b;
  undefined1 uStack_10a;
  undefined1 uStack_109;
  undefined1 local_108;
  undefined1 uStack_107;
  undefined1 uStack_106;
  undefined1 uStack_105;
  undefined1 uStack_104;
  undefined1 uStack_103;
  undefined1 uStack_102;
  undefined1 uStack_101;
  undefined1 uStack_100;
  undefined1 uStack_ff;
  undefined1 uStack_fe;
  undefined1 uStack_fd;
  undefined1 uStack_fc;
  undefined1 uStack_fb;
  undefined1 uStack_fa;
  undefined1 uStack_f9;
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined1 uStack_ee;
  undefined1 uStack_ed;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  undefined1 local_e8;
  undefined1 uStack_e7;
  undefined1 uStack_e6;
  undefined1 uStack_e5;
  undefined1 uStack_e4;
  undefined1 uStack_e3;
  undefined1 uStack_e2;
  undefined1 uStack_e1;
  undefined1 uStack_e0;
  undefined1 uStack_df;
  undefined1 uStack_de;
  undefined1 uStack_dd;
  undefined1 uStack_dc;
  undefined1 uStack_db;
  undefined1 uStack_da;
  undefined1 uStack_d9;
  undefined1 local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 uStack_c0;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  long local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  long local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = *in_RDI;
  uVar4 = in_RDI[1];
  uVar1 = CONCAT13(in_XMM0_Bh,CONCAT12(in_XMM0_Bg,CONCAT11(in_XMM0_Bf,in_XMM0_Be))) ^
          CONCAT13(in_XMM0_Bh,CONCAT12(in_XMM0_Bg,CONCAT11(in_XMM0_Bf,in_XMM0_Be)));
  uStack_c4 = (undefined1)uVar1;
  uStack_c3 = (undefined1)(uVar1 >> 8);
  uStack_c2 = (undefined1)(uVar1 >> 0x10);
  uStack_c1 = (undefined1)(uVar1 >> 0x18);
  uVar2 = CONCAT13(in_XMM0_Bl,CONCAT12(in_XMM0_Bk,CONCAT11(in_XMM0_Bj,in_XMM0_Bi))) ^
          CONCAT13(in_XMM0_Bl,CONCAT12(in_XMM0_Bk,CONCAT11(in_XMM0_Bj,in_XMM0_Bi)));
  uStack_117 = (undefined1)uVar2;
  uStack_115 = (undefined1)(uVar2 >> 8);
  uStack_113 = (undefined1)(uVar2 >> 0x10);
  uStack_111 = (undefined1)(uVar2 >> 0x18);
  uVar3 = CONCAT13(in_XMM0_Bp,CONCAT12(in_XMM0_Bo,CONCAT11(in_XMM0_Bn,in_XMM0_Bm))) ^
          CONCAT13(in_XMM0_Bp,CONCAT12(in_XMM0_Bo,CONCAT11(in_XMM0_Bn,in_XMM0_Bm)));
  uStack_10f = (undefined1)uVar3;
  uStack_10d = (undefined1)(uVar3 >> 8);
  uStack_10b = (undefined1)(uVar3 >> 0x10);
  uStack_109 = (undefined1)(uVar3 >> 0x18);
  local_98 = 0;
  uStack_97 = 0;
  uStack_96 = 0;
  uStack_95 = 0;
  local_28 = (ulong)uVar1 << 0x20;
  uStack_20 = CONCAT17(uStack_109,
                       CONCAT16(uStack_10b,CONCAT15(uStack_10d,CONCAT14(uStack_10f,uVar2))));
  uStack_10._0_1_ = (undefined1)uVar4;
  uStack_10._1_1_ = (undefined1)((ulong)uVar4 >> 8);
  uStack_10._2_1_ = (undefined1)((ulong)uVar4 >> 0x10);
  uStack_10._3_1_ = (undefined1)((ulong)uVar4 >> 0x18);
  uStack_10._4_1_ = (undefined1)((ulong)uVar4 >> 0x20);
  uStack_10._5_1_ = (undefined1)((ulong)uVar4 >> 0x28);
  uStack_10._6_1_ = (undefined1)((ulong)uVar4 >> 0x30);
  uStack_10._7_1_ = (undefined1)((ulong)uVar4 >> 0x38);
  local_118 = (undefined1)uStack_10;
  uStack_116 = uStack_10._1_1_;
  uStack_114 = uStack_10._2_1_;
  uStack_112 = uStack_10._3_1_;
  uStack_110 = uStack_10._4_1_;
  uStack_10e = uStack_10._5_1_;
  uStack_10c = uStack_10._6_1_;
  uStack_10a = uStack_10._7_1_;
  local_38 = in_RDI[4];
  uVar5 = in_RDI[5];
  local_a8 = 0;
  uStack_a7 = 0;
  uStack_a6 = 0;
  uStack_a5 = 0;
  local_48 = (ulong)uVar1 << 0x20;
  uStack_40 = CONCAT17(uStack_109,
                       CONCAT16(uStack_10b,CONCAT15(uStack_10d,CONCAT14(uStack_10f,uVar2))));
  uStack_30._0_1_ = (undefined1)uVar5;
  uStack_30._1_1_ = (undefined1)((ulong)uVar5 >> 8);
  uStack_30._2_1_ = (undefined1)((ulong)uVar5 >> 0x10);
  uStack_30._3_1_ = (undefined1)((ulong)uVar5 >> 0x18);
  uStack_30._4_1_ = (undefined1)((ulong)uVar5 >> 0x20);
  uStack_30._5_1_ = (undefined1)((ulong)uVar5 >> 0x28);
  uStack_30._6_1_ = (undefined1)((ulong)uVar5 >> 0x30);
  uStack_30._7_1_ = (undefined1)((ulong)uVar5 >> 0x38);
  local_108 = (undefined1)uStack_30;
  uStack_106 = uStack_30._1_1_;
  uStack_104 = uStack_30._2_1_;
  uStack_102 = uStack_30._3_1_;
  uStack_100 = uStack_30._4_1_;
  uStack_fe = uStack_30._5_1_;
  uStack_fc = uStack_30._6_1_;
  uStack_fa = uStack_30._7_1_;
  local_58 = in_RDI[8];
  uVar6 = in_RDI[9];
  local_b8 = 0;
  uStack_b7 = 0;
  uStack_b6 = 0;
  uStack_b5 = 0;
  local_68 = (ulong)uVar1 << 0x20;
  uStack_60 = CONCAT17(uStack_109,
                       CONCAT16(uStack_10b,CONCAT15(uStack_10d,CONCAT14(uStack_10f,uVar2))));
  uStack_50._0_1_ = (undefined1)uVar6;
  uStack_50._1_1_ = (undefined1)((ulong)uVar6 >> 8);
  uStack_50._2_1_ = (undefined1)((ulong)uVar6 >> 0x10);
  uStack_50._3_1_ = (undefined1)((ulong)uVar6 >> 0x18);
  uStack_50._4_1_ = (undefined1)((ulong)uVar6 >> 0x20);
  uStack_50._5_1_ = (undefined1)((ulong)uVar6 >> 0x28);
  uStack_50._6_1_ = (undefined1)((ulong)uVar6 >> 0x30);
  uStack_50._7_1_ = (undefined1)((ulong)uVar6 >> 0x38);
  local_f8 = (undefined1)uStack_50;
  uStack_f6 = uStack_50._1_1_;
  uStack_f4 = uStack_50._2_1_;
  uStack_f2 = uStack_50._3_1_;
  uStack_f0 = uStack_50._4_1_;
  uStack_ee = uStack_50._5_1_;
  uStack_ec = uStack_50._6_1_;
  uStack_ea = uStack_50._7_1_;
  local_78 = in_RDI[0xc];
  uVar7 = in_RDI[0xd];
  local_c8 = 0;
  uStack_c7 = 0;
  uStack_c6 = 0;
  uStack_c5 = 0;
  local_88 = (ulong)uVar1 << 0x20;
  uStack_80 = CONCAT17(uStack_109,
                       CONCAT16(uStack_10b,CONCAT15(uStack_10d,CONCAT14(uStack_10f,uVar2))));
  uStack_70._0_1_ = (undefined1)uVar7;
  uStack_70._1_1_ = (undefined1)((ulong)uVar7 >> 8);
  uStack_70._2_1_ = (undefined1)((ulong)uVar7 >> 0x10);
  uStack_70._3_1_ = (undefined1)((ulong)uVar7 >> 0x18);
  uStack_70._4_1_ = (undefined1)((ulong)uVar7 >> 0x20);
  uStack_70._5_1_ = (undefined1)((ulong)uVar7 >> 0x28);
  uStack_70._6_1_ = (undefined1)((ulong)uVar7 >> 0x30);
  uStack_70._7_1_ = (undefined1)((ulong)uVar7 >> 0x38);
  local_e8 = (undefined1)uStack_70;
  uStack_e6 = uStack_70._1_1_;
  uStack_e4 = uStack_70._2_1_;
  uStack_e2 = uStack_70._3_1_;
  uStack_e0 = uStack_70._4_1_;
  uStack_de = uStack_70._5_1_;
  uStack_dc = uStack_70._6_1_;
  uStack_da = uStack_70._7_1_;
  uStack_107 = uStack_117;
  uStack_105 = uStack_115;
  uStack_103 = uStack_113;
  uStack_101 = uStack_111;
  uStack_ff = uStack_10f;
  uStack_fd = uStack_10d;
  uStack_fb = uStack_10b;
  uStack_f9 = uStack_109;
  uStack_f7 = uStack_117;
  uStack_f5 = uStack_115;
  uStack_f3 = uStack_113;
  uStack_f1 = uStack_111;
  uStack_ef = uStack_10f;
  uStack_ed = uStack_10d;
  uStack_eb = uStack_10b;
  uStack_e9 = uStack_109;
  uStack_e7 = uStack_117;
  uStack_e5 = uStack_115;
  uStack_e3 = uStack_113;
  uStack_e1 = uStack_111;
  uStack_df = uStack_10f;
  uStack_dd = uStack_10d;
  uStack_db = uStack_10b;
  uStack_d9 = uStack_109;
  uStack_c0 = uStack_117;
  uStack_bf = uStack_115;
  uStack_be = uStack_113;
  uStack_bd = uStack_111;
  uStack_bc = uStack_10f;
  uStack_bb = uStack_10d;
  uStack_ba = uStack_10b;
  uStack_b9 = uStack_109;
  uStack_b4 = uStack_c4;
  uStack_b3 = uStack_c3;
  uStack_b2 = uStack_c2;
  uStack_b1 = uStack_c1;
  uStack_b0 = uStack_117;
  uStack_af = uStack_115;
  uStack_ae = uStack_113;
  uStack_ad = uStack_111;
  uStack_ac = uStack_10f;
  uStack_ab = uStack_10d;
  uStack_aa = uStack_10b;
  uStack_a9 = uStack_109;
  uStack_a4 = uStack_c4;
  uStack_a3 = uStack_c3;
  uStack_a2 = uStack_c2;
  uStack_a1 = uStack_c1;
  uStack_a0 = uStack_117;
  uStack_9f = uStack_115;
  uStack_9e = uStack_113;
  uStack_9d = uStack_111;
  uStack_9c = uStack_10f;
  uStack_9b = uStack_10d;
  uStack_9a = uStack_10b;
  uStack_99 = uStack_109;
  uStack_94 = uStack_c4;
  uStack_93 = uStack_c3;
  uStack_92 = uStack_c2;
  uStack_91 = uStack_c1;
  uStack_90 = uStack_117;
  uStack_8f = uStack_115;
  uStack_8e = uStack_113;
  uStack_8d = uStack_111;
  uStack_8c = uStack_10f;
  uStack_8b = uStack_10d;
  uStack_8a = uStack_10b;
  uStack_89 = uStack_109;
  uStack_70 = uVar7;
  uStack_50 = uVar6;
  uStack_30 = uVar5;
  uStack_10 = uVar4;
  alVar8 = convolve((__m128i *)&local_118,in_RSI);
  alVar8[0] = alVar8[0];
  alVar8[1] = alVar8[1];
  return alVar8;
}

Assistant:

static inline __m128i convolve_hi_y(const __m128i *const s,
                                    const __m128i *const coeffs) {
  __m128i ss[4];
  ss[0] = _mm_unpackhi_epi8(s[0], _mm_setzero_si128());
  ss[1] = _mm_unpackhi_epi8(s[2], _mm_setzero_si128());
  ss[2] = _mm_unpackhi_epi8(s[4], _mm_setzero_si128());
  ss[3] = _mm_unpackhi_epi8(s[6], _mm_setzero_si128());
  return convolve(ss, coeffs);
}